

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O3

void __thiscall pbrt::StatsAccumulator::StatsAccumulator(StatsAccumulator *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  Stats *pSVar3;
  _Rb_tree_header *p_Var4;
  memory_resource *pmVar5;
  memory_resource *pmVar6;
  
  this->stats = (Stats *)0x0;
  pSVar3 = (Stats *)operator_new(0x2c8);
  p_Var4 = &(pSVar3->counters)._M_t._M_impl.super__Rb_tree_header;
  p_Var1 = &(pSVar3->memoryCounters)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = &(pSVar3->intDistributions)._M_t._M_impl.super__Rb_tree_header;
  (pSVar3->counters)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pSVar3->counters)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pSVar3->counters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var4->_M_header;
  (pSVar3->counters)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var4->_M_header;
  (pSVar3->counters)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (pSVar3->memoryCounters)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pSVar3->memoryCounters)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pSVar3->memoryCounters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (pSVar3->memoryCounters)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (pSVar3->memoryCounters)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (pSVar3->intDistributions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pSVar3->intDistributions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (pSVar3->intDistributions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (pSVar3->intDistributions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  p_Var1 = &(pSVar3->floatDistributions)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = &(pSVar3->percentages)._M_t._M_impl.super__Rb_tree_header;
  (pSVar3->intDistributions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (pSVar3->floatDistributions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pSVar3->floatDistributions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (pSVar3->floatDistributions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (pSVar3->floatDistributions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (pSVar3->floatDistributions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (pSVar3->percentages)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pSVar3->percentages)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pSVar3->percentages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (pSVar3->percentages)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  p_Var1 = &(pSVar3->ratios)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = &(pSVar3->rareChecks)._M_t._M_impl.super__Rb_tree_header;
  (pSVar3->percentages)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (pSVar3->ratios)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pSVar3->ratios)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pSVar3->ratios)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (pSVar3->ratios)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (pSVar3->ratios)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (pSVar3->rareChecks)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pSVar3->rareChecks)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pSVar3->rareChecks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (pSVar3->rareChecks)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (pSVar3->rareChecks)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pmVar5 = pstd::pmr::new_delete_resource();
  (pSVar3->pixelTime).format = U256;
  (pSVar3->pixelTime).resolution.super_Tuple2<pbrt::Point2,_int>.x = 0;
  (pSVar3->pixelTime).resolution.super_Tuple2<pbrt::Point2,_int>.y = 0;
  pmVar6 = pstd::pmr::new_delete_resource();
  (pSVar3->pixelTime).channelNames.alloc.memoryResource = pmVar6;
  (pSVar3->pixelTime).channelNames.ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (pSVar3->pixelTime).encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = 0;
  (pSVar3->pixelTime).channelNames.nAlloc = 0;
  (pSVar3->pixelTime).channelNames.nStored = 0;
  (pSVar3->pixelTime).p8.alloc.memoryResource = pmVar5;
  (pSVar3->pixelTime).p8.ptr = (uchar *)0x0;
  (pSVar3->pixelTime).p8.nAlloc = 0;
  (pSVar3->pixelTime).p8.nStored = 0;
  (pSVar3->pixelTime).p16.alloc.memoryResource = pmVar5;
  (pSVar3->pixelTime).p16.ptr = (Half *)0x0;
  (pSVar3->pixelTime).p16.nAlloc = 0;
  (pSVar3->pixelTime).p16.nStored = 0;
  (pSVar3->pixelTime).p32.alloc.memoryResource = pmVar5;
  *(undefined1 (*) [64])&(pSVar3->pixelTime).p32.ptr = ZEXT464(0) << 0x40;
  *(undefined1 (*) [64])
   &(pSVar3->pixelCounterImages).super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
    _M_impl.super__Vector_impl_data._M_finish = ZEXT464(0) << 0x40;
  this->stats = pSVar3;
  return;
}

Assistant:

StatsAccumulator::StatsAccumulator() {
    stats = new Stats;
}